

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

char * archive_entry_acl_text(archive_entry *entry,wchar_t flags)

{
  wchar_t wVar1;
  char *pcVar2;
  wchar_t local_14;
  
  local_14 = flags;
  free((entry->acl).acl_text);
  (entry->acl).acl_text = (char *)0x0;
  wVar1 = archive_entry_acl_text_compat(&local_14);
  if (wVar1 == L'\0') {
    pcVar2 = archive_acl_to_text_l(&entry->acl,(ssize_t *)0x0,local_14,(archive_string_conv *)0x0);
    (entry->acl).acl_text = pcVar2;
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char *
archive_entry_acl_text(struct archive_entry *entry, int flags)
{
	free(entry->acl.acl_text);
	entry->acl.acl_text = NULL;
	if (archive_entry_acl_text_compat(&flags) == 0)
		entry->acl.acl_text = archive_acl_to_text_l(&entry->acl, NULL,
		    flags, NULL);

	return (entry->acl.acl_text);
}